

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

Id __thiscall
anon_unknown.dwarf_b0093a::TGlslangToSpvTraverser::accessChainLoad
          (TGlslangToSpvTraverser *this,TType *type)

{
  bool bVar1;
  CoherentFlags CVar2;
  MemoryAccessMask MVar3;
  MemoryAccessMask b;
  int iVar4;
  uint uVar5;
  Decoration precision;
  Decoration l_nonUniform;
  Decoration r_nonUniform;
  Scope scope;
  Id IVar6;
  undefined4 extraout_var;
  SpvVersion *pSVar7;
  undefined4 extraout_var_00;
  AccessChain local_140;
  Id local_e4;
  undefined1 local_e0 [4];
  Id loadedId;
  uint local_94;
  uint local_88;
  MemoryAccessMask local_84;
  uint alignment;
  MemoryAccessMask accessMask;
  AccessChain local_78;
  CoherentFlags local_20;
  Id local_1c;
  CoherentFlags coherentFlags;
  Id nominalTypeId;
  TType *type_local;
  TGlslangToSpvTraverser *this_local;
  
  _coherentFlags = type;
  local_1c = spv::Builder::accessChainGetInferredType(&this->builder);
  spv::Builder::getAccessChain(&local_78,&this->builder);
  local_20 = local_78.coherentFlags;
  spv::Builder::AccessChain::~AccessChain(&local_78);
  CVar2 = TranslateCoherent(this,_coherentFlags);
  accessMask._0_2_ = CVar2._0_2_;
  alignment = (uint)spv::Builder::AccessChain::CoherentFlags::operator|=
                              (&local_20,(CoherentFlags *)&accessMask);
  MVar3 = TranslateMemoryAccess(this,&local_20);
  b = spv::operator~(MakePointerAvailable);
  local_84 = spv::operator&(MVar3,b);
  iVar4 = (*_coherentFlags->_vptr_TType[0xb])();
  if (((((uint)(*(ulong *)(CONCAT44(extraout_var,iVar4) + 8) >> 7) & 0x1ff) == 0x48) &&
      (bVar1 = glslang::TIntermediate::usingVulkanMemoryModel(this->glslangIntermediate), bVar1)) &&
     (pSVar7 = glslang::TIntermediate::getSpv(this->glslangIntermediate), 0x105ff < pSVar7->spv)) {
    local_84 = spv::operator|(local_84,MemoryAccessVolatileMask);
  }
  spv::Builder::getAccessChain((AccessChain *)local_e0,&this->builder);
  spv::Builder::AccessChain::~AccessChain((AccessChain *)local_e0);
  local_88 = local_94;
  uVar5 = glslang::TType::getBufferReferenceAlignment(_coherentFlags);
  local_88 = uVar5 | local_88;
  precision = TranslatePrecisionDecoration(_coherentFlags);
  spv::Builder::getAccessChain(&local_140,&this->builder);
  l_nonUniform = TranslateNonUniformDecoration(this,&local_140.coherentFlags);
  iVar4 = (*_coherentFlags->_vptr_TType[0xb])();
  r_nonUniform = TranslateNonUniformDecoration(this,(TQualifier *)CONCAT44(extraout_var_00,iVar4));
  IVar6 = local_1c;
  MVar3 = local_84;
  scope = TranslateMemoryScope(this,&local_20);
  IVar6 = spv::Builder::accessChainLoad
                    (&this->builder,precision,l_nonUniform,r_nonUniform,IVar6,MVar3,scope,local_88);
  spv::Builder::AccessChain::~AccessChain(&local_140);
  local_e4 = IVar6;
  iVar4 = (*_coherentFlags->_vptr_TType[7])();
  if (iVar4 == 0xc) {
    local_e4 = convertLoadedBoolInUniformToUint(this,_coherentFlags,local_1c,local_e4);
  }
  return local_e4;
}

Assistant:

spv::Id TGlslangToSpvTraverser::accessChainLoad(const glslang::TType& type)
{
    spv::Id nominalTypeId = builder.accessChainGetInferredType();

    spv::Builder::AccessChain::CoherentFlags coherentFlags = builder.getAccessChain().coherentFlags;
    coherentFlags |= TranslateCoherent(type);

    spv::MemoryAccessMask accessMask = spv::MemoryAccessMask(TranslateMemoryAccess(coherentFlags) & ~spv::MemoryAccessMakePointerAvailableKHRMask);
    // If the value being loaded is HelperInvocation, SPIR-V 1.6 is being generated (so that
    // SPV_EXT_demote_to_helper_invocation is in core) and the memory model is in use, add
    // the Volatile MemoryAccess semantic.
    if (type.getQualifier().builtIn == glslang::EbvHelperInvocation &&
        glslangIntermediate->usingVulkanMemoryModel() &&
        glslangIntermediate->getSpv().spv >= glslang::EShTargetSpv_1_6) {
        accessMask = spv::MemoryAccessMask(accessMask | spv::MemoryAccessVolatileMask);
    }

    unsigned int alignment = builder.getAccessChain().alignment;
    alignment |= type.getBufferReferenceAlignment();

    spv::Id loadedId = builder.accessChainLoad(TranslatePrecisionDecoration(type),
        TranslateNonUniformDecoration(builder.getAccessChain().coherentFlags),
        TranslateNonUniformDecoration(type.getQualifier()),
        nominalTypeId,
        accessMask,
        TranslateMemoryScope(coherentFlags),
        alignment);

    // Need to convert to abstract types when necessary
    if (type.getBasicType() == glslang::EbtBool) {
        loadedId = convertLoadedBoolInUniformToUint(type, nominalTypeId, loadedId);
    }

    return loadedId;
}